

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

int node_edge_compare(void *l,void *r)

{
  void *r_local;
  void *l_local;
  undefined4 local_4;
  
  if (*l < *r) {
    local_4 = -1;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int node_edge_compare (const void *l, const void *r)
{
    /* 
     * NOTE: Because edge alphabets are unique in every node we ignore
     * equivalence case.
     */
    if (((struct act_edge *)l)->alpha >= ((struct act_edge *)r)->alpha)
        return 1;
    else
        return -1;
}